

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O2

bool __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::CheckReader<mp::SuffixReader<int>>
          (SOLReader2<mp::SOLHandler_Easy> *this,SuffixReader<int> *rd,NLW2_SOLReadResultCode *rr)

{
  NLW2_SOLReadResultCode NVar1;
  
  NVar1 = (rd->super_SparseVecReader<int>).rr_;
  if (NVar1 == NLW2_SOLRead_Bad_Line) {
    NVar1 = ReportBadLine(this,&(rd->super_SparseVecReader<int>).err_msg_);
  }
  else if (NVar1 == NLW2_SOLRead_Early_EOF) {
    NVar1 = ReportEarlyEof(this);
  }
  else if ((rd->super_SparseVecReader<int>).n_ == 0) {
    if (NVar1 == NLW2_SOLRead_OK) {
      return true;
    }
    serror(this,(rd->super_SparseVecReader<int>).err_msg_._M_dataplus._M_p);
    ReportBadFormat(this);
    NVar1 = (rd->super_SparseVecReader<int>).rr_;
  }
  else {
    serror(this,"vector not read completely");
    NVar1 = ReportBadFormat(this);
  }
  *rr = NVar1;
  return false;
}

Assistant:

bool CheckReader(const Reader& rd, NLW2_SOLReadResultCode& rr) {
    if (NLW2_SOLRead_Early_EOF == rd.ReadResult())
      return (rr=ReportEarlyEof(), false);
    if (NLW2_SOLRead_Bad_Line == rd.ReadResult())
      return (rr=ReportBadLine(rd.ErrorMessage()), false);
    if (rd.Size()) {       // unfinished
      serror("vector not read completely");
      return (rr=ReportBadFormat(), false);
    }
    if (NLW2_SOLRead_OK != rd.ReadResult()) {
      serror( rd.ErrorMessage().c_str() );
      ReportBadFormat();
      return (rr=rd.ReadResult(), false);
    }
    return true;
  }